

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O2

Wlc_Ntk_t * Wlc_ReadSmtBuffer(char *pFileName,char *pBuffer,char *pLimit)

{
  char *pcVar1;
  char cVar2;
  int *__ptr;
  void *__ptr_00;
  char *pcVar3;
  Smt_Prs_t *p;
  Abc_Nam_t *p_00;
  Wlc_Ntk_t *pWVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  Vec_Int_t *__ptr_01;
  long lVar8;
  long lVar9;
  int iVar10;
  
  uVar6 = 0;
  uVar5 = 0;
  for (pcVar3 = pBuffer; pcVar3 < pLimit; pcVar3 = pcVar3 + 1) {
    cVar2 = *pcVar3;
    if (cVar2 == '(') {
      uVar6 = uVar6 + 1;
    }
    else if (cVar2 == ')') {
      uVar5 = uVar5 + 1;
    }
    else if (cVar2 == ';') {
      while ((cVar2 != '\0' && (cVar2 != '\n'))) {
        *pcVar3 = ' ';
        pcVar1 = pcVar3 + 1;
        pcVar3 = pcVar3 + 1;
        cVar2 = *pcVar1;
      }
    }
  }
  if (uVar6 == uVar5) {
    if (uVar6 == 0) {
      puts("The input SMTLIB file has no opening or closing parentheses.");
      pWVar4 = (Wlc_Ntk_t *)0x0;
    }
    else {
      p = (Smt_Prs_t *)calloc(1,0x430);
      p->pName = pFileName;
      p->pBuffer = pBuffer;
      p->pLimit = pLimit;
      p->pCur = pBuffer;
      p_00 = Abc_NamStart(1000,0x18);
      p->pStrs = p_00;
      for (iVar10 = 1; lVar8 = 0x10, iVar10 != 0xb; iVar10 = iVar10 + 1) {
        do {
          lVar9 = lVar8;
          if (lVar9 + 0x10 == 0xc0) {
            pcVar3 = (char *)0x0;
            goto LAB_002bc914;
          }
          lVar8 = lVar9 + 0x10;
        } while (*(int *)((long)&s_Types[0].Type + lVar9) != iVar10);
        pcVar3 = *(char **)((long)&s_Types[0].pName + lVar9);
LAB_002bc914:
        Abc_NamStrFindOrAdd(p_00,pcVar3,(int *)0x0);
      }
      iVar10 = Abc_NamObjNumMax(p_00);
      if (iVar10 != 0xb) {
        __assert_fail("Abc_NamObjNumMax(p) == SMT_PRS_END",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcReadSmt.c"
                      ,0x61,"void Smt_AddTypes(Abc_Nam_t *)");
      }
      Vec_IntGrow(&p->vStack,100);
      Vec_WecGrow(&p->vObjs,uVar6 + 1);
      Smt_PrsReadLines(p);
      if (p->ErrorStr[0] == '\0') {
        pWVar4 = Smt_PrsBuild(p);
      }
      else {
        uVar7 = 0;
        for (pcVar3 = p->pBuffer; pcVar3 < p->pCur; pcVar3 = pcVar3 + 1) {
          uVar7 = (ulong)((int)uVar7 + (uint)(*pcVar3 == '\n'));
        }
        pWVar4 = (Wlc_Ntk_t *)0x0;
        printf("Line %d: %s\n",uVar7,p->ErrorStr);
      }
      if (p->pStrs != (Abc_Nam_t *)0x0) {
        Abc_NamDeref(p->pStrs);
      }
      __ptr = (p->vStack).pArray;
      if (__ptr != (int *)0x0) {
        free(__ptr);
        (p->vStack).pArray = (int *)0x0;
      }
      (p->vStack).nCap = 0;
      (p->vStack).nSize = 0;
      __ptr_01 = (p->vObjs).pArray;
      lVar8 = 8;
      for (lVar9 = 0; lVar9 < (p->vObjs).nCap; lVar9 = lVar9 + 1) {
        __ptr_00 = *(void **)((long)&__ptr_01->nCap + lVar8);
        if (__ptr_00 != (void *)0x0) {
          free(__ptr_00);
          __ptr_01 = (p->vObjs).pArray;
          *(undefined8 *)((long)&__ptr_01->nCap + lVar8) = 0;
        }
        lVar8 = lVar8 + 0x10;
      }
      free(__ptr_01);
      free(p);
    }
  }
  else {
    pWVar4 = (Wlc_Ntk_t *)0x0;
    printf("The input SMTLIB file has different number of opening and closing parentheses (%d and %d).\n"
           ,(ulong)uVar6);
  }
  return pWVar4;
}

Assistant:

Wlc_Ntk_t * Wlc_ReadSmtBuffer( char * pFileName, char * pBuffer, char * pLimit )
{
    Wlc_Ntk_t * pNtk = NULL;
    int nCount = Smt_PrsRemoveComments( pBuffer, pLimit );
    Smt_Prs_t * p = Smt_PrsAlloc( pFileName, pBuffer, pLimit, nCount );
    if ( p == NULL )
        return NULL;
    Smt_PrsReadLines( p );
    //Smt_PrsPrintParser( p );
    if ( Smt_PrsErrorPrint(p) )
        pNtk = Smt_PrsBuild( p );
    Smt_PrsFree( p );
    return pNtk;
}